

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::HDivPermutation
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_> *this,
          int side,TPZVec<int> *permutegather)

{
  int iVar1;
  uint uVar2;
  MElementType MVar3;
  TPZGeoNode *pTVar4;
  ulong uVar5;
  TPZManVector<long,_4> id;
  undefined1 local_1b0 [24];
  int64_t local_198;
  long local_190 [12];
  ios_base local_130 [264];
  
  iVar1 = pztopology::TPZQuadrilateral::SideDimension(side);
  if (iVar1 != 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x10),"HDivPermutation called with wrong side parameter ",
               0x31);
    std::ostream::operator<<((ostream *)(local_1b0 + 0x10),side);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  uVar2 = pztopology::TPZQuadrilateral::NSideNodes(side);
  TPZManVector<long,_4>::TPZManVector((TPZManVector<long,_4> *)local_1b0,(long)(int)uVar2);
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      iVar1 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x2d0))(this,side,uVar5 & 0xffffffff);
      pTVar4 = TPZGeoEl::NodePtr(&this->super_TPZGeoEl,iVar1);
      *(long *)(local_1b0._8_8_ + uVar5 * 8) = (long)pTVar4->fId;
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  MVar3 = pztopology::TPZQuadrilateral::Type(side);
  switch(MVar3) {
  case EPoint:
    *permutegather->fStore = 0;
    break;
  case EOned:
    iVar1 = pztopology::TPZLine::GetTransformId((TPZVec<long> *)local_1b0);
    pztopology::TPZLine::GetSideHDivPermutation(iVar1,permutegather);
    break;
  case ETriangle:
    iVar1 = pztopology::TPZTriangle::GetTransformId((TPZVec<long> *)local_1b0);
    pztopology::TPZTriangle::GetSideHDivPermutation(iVar1,permutegather);
    break;
  case EQuadrilateral:
    iVar1 = pztopology::TPZQuadrilateral::GetTransformId((TPZVec<long> *)local_1b0);
    pztopology::TPZQuadrilateral::GetSideHDivPermutation(iVar1,permutegather);
    break;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
               ,0x364);
  }
  if ((long *)local_1b0._8_8_ != local_190) {
    local_198 = 0;
    local_1b0._0_8_ = &PTR__TPZVec_01813f30;
    if ((long *)local_1b0._8_8_ != (long *)0x0) {
      operator_delete__((void *)local_1b0._8_8_);
    }
  }
  return;
}

Assistant:

inline void TPZGeoElRefLess<TGeo>::HDivPermutation(int side, TPZVec<int> &permutegather)
{
	int dimension = TGeo::Dimension;
	int sidedimension = TGeo::SideDimension(side);

	if(dimension != sidedimension+1)
	{
		std::stringstream sout;
		sout << "HDivPermutation called with wrong side parameter " << side;
#ifdef PZ_LOG
        TPZLogger loggerrefless ("pz.mesh.tpzgeoelrefless");
		LOGPZ_ERROR(loggerrefless,sout.str())
#endif
	}
    
    // Douglas -- teste em 2014 09 04
    // conta o numero de lados da face
    const int64_t nsidenodes = TGeo::NSideNodes(side);
    TPZManVector<int64_t,4> id(nsidenodes);  // 
    
	for(int inode=0; inode<nsidenodes; inode++)
    {
        // esta parte pega os indices locais dos nos apenas da face em questao
        int64_t nodeindex = SideNodeLocId(side, inode);
        // com base nestes indices locais, pegamos os indices globais para determinar a permutacao
        id[inode] = NodePtr(nodeindex)->Id();
    }
    
    // Esse bloco parece pegar todos os vertices do cubo para fazer a permutacao, deveria ser da face
//    TPZManVector<int64_t,TGeo::NCornerNodes> id(TGeo::NCornerNodes);
//	for(int i=0; i<TGeo::NCornerNodes; i++)
//    {
//        int64_t nodeindex = fGeo.fNodeIndexes[i];
//        id[i] = Mesh()->NodeVec()[nodeindex].Id();
//    }
    
    MElementType sidetype = TGeo::Type(side);
    int transformid;
    switch (sidetype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(id);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(id);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(id);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EPoint:
            transformid = 0;
            permutegather[0] = 0;
            break;
        default:
            DebugStop();
            break;
    }
#ifdef PZ_LOG
    TPZLogger loggerrefless ("pz.mesh.tpzgeoelrefless");
    if (loggerrefless.isDebugEnabled()) {
        std::stringstream sout;
        sout << "side = " << side << " transform id " << transformid << " permutegather " << permutegather;
        LOGPZ_DEBUG(loggerrefless, sout.str())
    }
#endif
}